

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sampler
          (Impl *this,VkSamplerCreateInfo *create_info,ScratchAllocator *alloc,
          VkSamplerCreateInfo **out_create_info)

{
  bool bVar1;
  VkSamplerCreateInfo *pVVar2;
  
  pVVar2 = copy<VkSamplerCreateInfo>(this,create_info,1,alloc);
  *(byte *)&pVVar2->flags = (byte)pVVar2->flags & 0xf7;
  bVar1 = copy_pnext_chain(this,pVVar2->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_create_info = pVVar2;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::copy_sampler(const VkSamplerCreateInfo *create_info, ScratchAllocator &alloc,
                                       VkSamplerCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	constexpr VkSamplerCreateFlagBits ignore_capture_replay_flags =
			VK_SAMPLER_CREATE_DESCRIPTOR_BUFFER_CAPTURE_REPLAY_BIT_EXT;
	info->flags &= ~ignore_capture_replay_flags;

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}